

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall
toml::detail::character_in_range::expected_chars_abi_cxx11_
          (character_in_range *this,location *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffcc;
  allocator<char> local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_1a);
  show_char_abi_cxx11_(in_stack_ffffffffffffffcc);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,(char *)in_stack_ffffffffffffff68);
  show_char_abi_cxx11_(in_stack_ffffffffffffffcc);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,(char *)in_stack_ffffffffffffff68);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string character_in_range::expected_chars(location&) const
{
    std::string expected("from `");
    expected += show_char(from_);
    expected += "` to `";
    expected += show_char(to_);
    expected += "`";
    return expected;
}